

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ArrayWithPreallocation.h
# Opt level: O3

void __thiscall
soul::ArrayWithPreallocation<soul::TokenisedPathString::Section,_8UL>::reserve
          (ArrayWithPreallocation<soul::TokenisedPathString::Section,_8UL> *this,size_t minSize)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  ulong uVar3;
  Section *pSVar4;
  undefined8 uVar5;
  Section *pSVar6;
  size_t sVar7;
  long lVar8;
  ulong uVar9;
  
  uVar3 = this->numAllocated;
  if (uVar3 < minSize) {
    uVar9 = minSize + 0xf & 0xfffffffffffffff0;
    if (uVar9 != 0) {
      pSVar6 = (Section *)operator_new__(uVar9 << 4);
      sVar7 = this->numActive;
      if (sVar7 != 0) {
        pSVar4 = this->items;
        lVar8 = 0;
        do {
          puVar1 = (undefined8 *)((long)&pSVar4->start + lVar8);
          uVar5 = puVar1[1];
          puVar2 = (undefined8 *)((long)&pSVar6->start + lVar8);
          *puVar2 = *puVar1;
          puVar2[1] = uVar5;
          lVar8 = lVar8 + 0x10;
          sVar7 = sVar7 - 1;
        } while (sVar7 != 0);
      }
      if ((8 < uVar3) && (this->items != (Section *)0x0)) {
        operator_delete__(this->items);
      }
      this->items = pSVar6;
    }
    this->numAllocated = uVar9;
  }
  return;
}

Assistant:

void reserve (size_t minSize)
    {
        if (minSize > numAllocated)
        {
            minSize = getAlignedSize<16> (minSize);

            if (minSize > preallocatedItems)
            {
                auto* newObjects = reinterpret_cast<Item*> (new char[minSize * sizeof (Item)]);

                for (size_t i = 0; i < numActive; ++i)
                {
                    new (newObjects + i) Item (std::move (items[i]));
                    items[i].~Item();
                }

                freeIfHeapAllocated();
                items = newObjects;
            }

            numAllocated = minSize;
        }
    }